

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::execute_cfunction(Forth *this)

{
  bool bVar1;
  pointer ppVar2;
  _func_void_Forth_ptr *function;
  _Self local_20;
  iterator finded;
  Xt num;
  Forth *this_local;
  
  finded._M_node._4_4_ = this->executingWord;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_void_(*)(cppforth::Forth_*),_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_void_(*)(cppforth::Forth_*)>_>_>
       ::find(&this->cfunctions,(key_type *)((long)&finded._M_node + 4));
  function = (_func_void_Forth_ptr *)
             std::
             map<unsigned_int,_void_(*)(cppforth::Forth_*),_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_void_(*)(cppforth::Forth_*)>_>_>
             ::end(&this->cfunctions);
  bVar1 = std::operator==(&local_20,(_Self *)&function);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_void_(*)(cppforth::Forth_*)>_>::
             operator->(&local_20);
    if (ppVar2->second != (_func_void_Forth_ptr *)0x0) {
      (*ppVar2->second)(this);
    }
  }
  return;
}

Assistant:

void execute_cfunction(){
			auto num = executingWord;
			auto finded = cfunctions.find(num) ;
			if (finded != cfunctions.end()){
				auto function = finded->second;
				if(function)
					function(this);
			}
		}